

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
::RegisterTests(ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
                *this)

{
  ParamNameGeneratorFunc *pPVar1;
  TestMetaFactoryBase<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
  *pTVar2;
  _Alloc_hider test_suite_name_00;
  char *value_param;
  _Alloc_hider name;
  byte bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  pointer __lhs;
  undefined4 extraout_var;
  long *plVar9;
  undefined8 *puVar10;
  ostream *poVar11;
  size_type sVar12;
  long lVar13;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pointer psVar14;
  size_type index;
  ulong uVar15;
  bool bVar16;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_310;
  char *local_308;
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>
  test_info;
  size_t local_2f0;
  ParamGenerator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
  generator;
  string test_suite_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  string param_name;
  char *local_248 [4];
  string local_228;
  CodeLocation local_208;
  CodeLocation local_1e0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [2];
  size_t local_188;
  long *plVar8;
  undefined4 extraout_var_00;
  
  psVar14 = (this->tests_).
            super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  bVar16 = false;
  do {
    if (psVar14 ==
        (this->tests_).
        super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (!bVar16) {
        iVar7 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
                  [2])(this);
        CodeLocation::CodeLocation(&local_1e0,&this->code_location_);
        InsertSyntheticTestCase
                  ((string *)CONCAT44(extraout_var_03,iVar7),&local_1e0,
                   (this->tests_).
                   super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_start !=
                   (this->tests_).
                   super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        std::__cxx11::string::~string((string *)&local_1e0);
      }
      return;
    }
    test_info.
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (psVar14->
              super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count
              (&test_info.
                super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               &(psVar14->
                super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount);
    for (__lhs = (this->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __lhs != (this->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
      (*__lhs->generator)(&generator);
      pPVar1 = __lhs->name_func;
      local_308 = __lhs->file;
      iVar7 = __lhs->line;
      test_suite_name._M_dataplus._M_p = (pointer)&test_suite_name.field_2;
      test_suite_name._M_string_length = 0;
      test_suite_name.field_2._M_local_buf[0] = '\0';
      if ((__lhs->name)._M_string_length != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b8,&__lhs->name,"/");
        std::__cxx11::string::operator=((string *)&test_suite_name,(string *)local_1b8);
        std::__cxx11::string::~string((string *)local_1b8);
      }
      std::__cxx11::string::append((string *)&test_suite_name);
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &test_param_names._M_t._M_impl.super__Rb_tree_header._M_header;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar5 = (*(generator.impl_.
                 super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
      plVar8 = (long *)CONCAT44(extraout_var,iVar5);
      local_2f0 = 0;
      while( true ) {
        iVar5 = (*(generator.impl_.
                   super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
        plVar9 = (long *)CONCAT44(extraout_var_00,iVar5);
        if (plVar8 == plVar9) {
          bVar3 = 0;
        }
        else {
          bVar3 = (**(code **)(*plVar8 + 0x30))(plVar8,plVar9);
          bVar3 = bVar3 ^ 1;
        }
        if (plVar9 != (long *)0x0) {
          (**(code **)(*plVar9 + 8))(plVar9);
        }
        if (bVar3 == 0) break;
        Message::Message((Message *)&local_310);
        puVar10 = (undefined8 *)(**(code **)(*plVar8 + 0x28))();
        local_1b8._0_8_ = *puVar10;
        local_1b8._8_8_ = puVar10[1];
        local_1a8[0]._0_8_ = puVar10[2];
        local_1a8[0]._8_8_ = puVar10[3];
        local_1a8[1]._0_8_ = puVar10[4];
        local_1a8[1]._8_8_ = puVar10[5];
        local_188 = local_2f0;
        (*pPVar1)(&param_name,
                  (TestParamInfo<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
                   *)local_1b8);
        if (param_name._M_string_length == 0) {
          bVar16 = false;
        }
        else {
          for (uVar15 = 0; bVar16 = param_name._M_string_length <= uVar15, !bVar16;
              uVar15 = uVar15 + 1) {
            bVar4 = IsAlNum(param_name._M_dataplus._M_p[uVar15]);
            if ((!bVar4) && (param_name._M_dataplus._M_p[uVar15] != '_')) break;
          }
        }
        bVar16 = IsTrue(bVar16);
        if (!bVar16) {
          GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x246);
          poVar11 = std::operator<<((ostream *)&std::cerr,
                                    "Condition IsValidParamName(param_name) failed. ");
          poVar11 = std::operator<<(poVar11,"Parameterized test name \'");
          poVar11 = std::operator<<(poVar11,(string *)&param_name);
          poVar11 = std::operator<<(poVar11,"\' is invalid, in ");
          poVar11 = std::operator<<(poVar11,local_308);
          poVar11 = std::operator<<(poVar11," line ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar7);
          std::endl<char,std::char_traits<char>>(poVar11);
          GTestLog::~GTestLog((GTestLog *)local_1b8);
        }
        sVar12 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count(&test_param_names,&param_name);
        bVar16 = IsTrue(sVar12 == 0);
        if (!bVar16) {
          GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x24a);
          poVar11 = std::operator<<((ostream *)&std::cerr,
                                    "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar11 = std::operator<<(poVar11,"Duplicate parameterized test name \'");
          poVar11 = std::operator<<(poVar11,(string *)&param_name);
          poVar11 = std::operator<<(poVar11,"\', in ");
          poVar11 = std::operator<<(poVar11,local_308);
          poVar11 = std::operator<<(poVar11," line ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar7);
          std::endl<char,std::char_traits<char>>(poVar11);
          GTestLog::~GTestLog((GTestLog *)local_1b8);
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&test_param_names,&param_name);
        if (((test_info.
              super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->test_base_name)._M_string_length != 0) {
          std::operator<<((ostream *)(local_310._M_head_impl + 0x10),
                          (string *)
                          &(test_info.
                            super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->test_base_name);
          std::operator<<((ostream *)(local_310._M_head_impl + 0x10),"/");
        }
        std::operator<<((ostream *)(local_310._M_head_impl + 0x10),(string *)&param_name);
        test_suite_name_00 = test_suite_name._M_dataplus;
        Message::GetString_abi_cxx11_(&local_228,(Message *)&local_310);
        name._M_p = local_228._M_dataplus._M_p;
        lVar13 = (**(code **)(*plVar8 + 0x28))();
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        poVar11 = std::operator<<((ostream *)(local_1b8 + 0x10),"width/height:");
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,*(int *)(lVar13 + 8));
        poVar11 = std::operator<<(poVar11,"/");
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,*(int *)(lVar13 + 0xc));
        poVar11 = std::operator<<(poVar11," function:");
        poVar11 = std::ostream::_M_insert<void_const*>(poVar11);
        poVar11 = std::operator<<(poVar11," bit-depth:");
        std::ostream::operator<<(poVar11,*(int *)(lVar13 + 0x20));
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        value_param = local_248[0];
        CodeLocation::CodeLocation
                  (&local_208,
                   &(test_info.
                     super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->code_location);
        iVar5 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
                  [3])(this);
        bVar16 = IsTrue(true);
        if (!bVar16) {
          GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x20e);
          poVar11 = std::operator<<((ostream *)&std::cerr,
                                    "Condition !test_case_fp || !test_suite_fp failed. ");
          poVar11 = std::operator<<(poVar11,
                                    "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                                   );
          poVar11 = std::operator<<(poVar11,local_308);
          poVar11 = std::operator<<(poVar11,":");
          std::ostream::operator<<(poVar11,iVar7);
          GTestLog::~GTestLog((GTestLog *)local_1b8);
        }
        bVar16 = IsTrue(true);
        if (!bVar16) {
          GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x223);
          poVar11 = std::operator<<((ostream *)&std::cerr,
                                    "Condition !test_case_fp || !test_suite_fp failed. ");
          poVar11 = std::operator<<(poVar11,
                                    "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                                   );
          poVar11 = std::operator<<(poVar11,local_308);
          poVar11 = std::operator<<(poVar11,":");
          std::ostream::operator<<(poVar11,iVar7);
          GTestLog::~GTestLog((GTestLog *)local_1b8);
        }
        pTVar2 = ((test_info.
                   super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->test_meta_factory)._M_t.
                 super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>_>_>
                 .
                 super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>_*,_false>
                 ._M_head_impl;
        (**(code **)(*plVar8 + 0x28))();
        iVar6 = (*pTVar2->_vptr_TestMetaFactoryBase[2])(pTVar2);
        MakeAndRegisterTestInfo
                  (test_suite_name_00._M_p,name._M_p,(char *)0x0,value_param,&local_208,
                   (TypeId)CONCAT44(extraout_var_01,iVar5),(SetUpTestSuiteFunc)0x0,
                   (TearDownTestSuiteFunc)0x0,(TestFactoryBase *)CONCAT44(extraout_var_02,iVar6));
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)local_248);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&param_name);
        if (local_310._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_310._M_head_impl + 8))();
        }
        (**(code **)(*plVar8 + 0x18))();
        local_2f0 = local_2f0 + 1;
        bVar16 = true;
      }
      if (plVar8 != (long *)0x0) {
        (**(code **)(*plVar8 + 8))();
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&test_param_names._M_t);
      std::__cxx11::string::~string((string *)&test_suite_name);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&generator.impl_.
                  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&test_info.
                super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    psVar14 = psVar14 + 1;
  } while( true );
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      std::shared_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin();
           gen_it != instantiations_.end(); ++gen_it) {
        const std::string& instantiation_name = gen_it->name;
        ParamGenerator<ParamType> generator((*gen_it->generator)());
        ParamNameGeneratorFunc* name_func = gen_it->name_func;
        const char* file = gen_it->file;
        int line = gen_it->line;

        std::string test_suite_name;
        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        test_suite_name += test_info->test_suite_base_name;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          generated_instantiations = true;

          Message test_name_stream;

          std::string param_name =
              name_func(TestParamInfo<ParamType>(*param_it, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid, in " << file << " line " << line << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          test_param_names.insert(param_name);

          if (!test_info->test_base_name.empty()) {
            test_name_stream << test_info->test_base_name << "/";
          }
          test_name_stream << param_name;
          MakeAndRegisterTestInfo(
              test_suite_name.c_str(), test_name_stream.GetString().c_str(),
              nullptr,  // No type parameter.
              PrintToString(*param_it).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }    // for gen_it
    }      // for test_it

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }